

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O0

void BrotliStoreHuffmanTreeToBitMask
               (size_t huffman_tree_size,uint8_t *huffman_tree,uint8_t *huffman_tree_extra_bits,
               uint8_t *code_length_bitdepth,uint16_t *code_length_bitdepth_symbols,
               size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ulong uVar2;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  ulong local_f8;
  size_t ix;
  size_t i;
  size_t *storage_ix_local;
  uint16_t *code_length_bitdepth_symbols_local;
  uint8_t *code_length_bitdepth_local;
  uint8_t *huffman_tree_extra_bits_local;
  uint8_t *huffman_tree_local;
  size_t huffman_tree_size_local;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  
  for (local_f8 = 0; local_f8 < huffman_tree_size; local_f8 = local_f8 + 1) {
    uVar2 = (ulong)huffman_tree[local_f8];
    bVar1 = code_length_bitdepth[uVar2];
    *(ulong *)(storage + (*storage_ix >> 3)) =
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3)) |
         (ulong)code_length_bitdepth_symbols[uVar2] << ((byte)*storage_ix & 7);
    *storage_ix = *storage_ix + (ulong)bVar1;
    if (uVar2 == 0x10) {
      *(ulong *)(storage + (*storage_ix >> 3)) =
           (ulong)huffman_tree_extra_bits[local_f8] << ((byte)*storage_ix & 7) |
           (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = *storage_ix + 2;
    }
    else if (uVar2 == 0x11) {
      *(ulong *)(storage + (*storage_ix >> 3)) =
           (ulong)huffman_tree_extra_bits[local_f8] << ((byte)*storage_ix & 7) |
           (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = *storage_ix + 3;
    }
  }
  return;
}

Assistant:

static void BrotliStoreHuffmanTreeToBitMask(
    const size_t huffman_tree_size, const uint8_t* huffman_tree,
    const uint8_t* huffman_tree_extra_bits, const uint8_t* code_length_bitdepth,
    const uint16_t* code_length_bitdepth_symbols,
    size_t* BROTLI_RESTRICT storage_ix, uint8_t* BROTLI_RESTRICT storage) {
  size_t i;
  for (i = 0; i < huffman_tree_size; ++i) {
    size_t ix = huffman_tree[i];
    BrotliWriteBits(code_length_bitdepth[ix], code_length_bitdepth_symbols[ix],
                    storage_ix, storage);
    /* Extra bits */
    switch (ix) {
      case BROTLI_REPEAT_PREVIOUS_CODE_LENGTH:
        BrotliWriteBits(2, huffman_tree_extra_bits[i], storage_ix, storage);
        break;
      case BROTLI_REPEAT_ZERO_CODE_LENGTH:
        BrotliWriteBits(3, huffman_tree_extra_bits[i], storage_ix, storage);
        break;
    }
  }
}